

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask19_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 uVar5;
  undefined1 auVar7 [16];
  undefined1 auVar6 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x1c18140c));
  uVar2 = in[4];
  *out = uVar1 << 0x13 | *in;
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar1));
  uVar5 = auVar6._0_4_;
  auVar7._4_4_ = uVar5;
  auVar7._0_4_ = uVar5;
  auVar7._8_4_ = uVar5;
  auVar7._12_4_ = uVar5;
  auVar3 = vpshufd_avx(auVar6,0x94);
  auVar4 = vpsllvd_avx2(auVar6,_DAT_001a6080);
  auVar6 = vpinsrd_avx(auVar7,uVar1,0);
  auVar7 = vpsrlvd_avx2(auVar6,_DAT_001a6060);
  auVar6 = vpinsrd_avx(auVar3,in[2] << 6,0);
  auVar3 = vpsrlvd_avx2(auVar3,_DAT_001a6070);
  auVar6 = vpinsrd_avx(auVar6,uVar2 << 0xc,1);
  auVar6 = vpor_avx(auVar6,auVar7);
  auVar6 = vpblendd_avx2(auVar6,auVar3,0xc);
  auVar6 = vpor_avx(auVar4,auVar6);
  *(undefined1 (*) [16])(out + 1) = auVar6;
  return out + 5;
}

Assistant:

uint32_t *__fastpackwithoutmask19_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (19 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (19 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (19 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (19 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;

  return out + 1;
}